

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QRegularExpression>::reallocate
          (QMovableArrayOps<QRegularExpression> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QRegularExpression>_*,_QRegularExpression_*> pVar1;
  
  pVar1 = QTypedArrayData<QRegularExpression>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QRegularExpression>).
                     super_QArrayDataPointer<QRegularExpression>.d,
                     (this->super_QGenericArrayOps<QRegularExpression>).
                     super_QArrayDataPointer<QRegularExpression>.ptr,alloc,option);
  if (pVar1.second != (QRegularExpression *)0x0) {
    (this->super_QGenericArrayOps<QRegularExpression>).super_QArrayDataPointer<QRegularExpression>.d
         = pVar1.first;
    (this->super_QGenericArrayOps<QRegularExpression>).super_QArrayDataPointer<QRegularExpression>.
    ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }